

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::metricToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,metric_name mn)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(mn) {
  case f1score:
    pcVar2 = "f1score";
    paVar1 = &local_9;
    break;
  case f1scoreLabel:
    pcVar2 = "f1scoreLabel";
    paVar1 = &local_a;
    break;
  case precisionAtRecall:
    pcVar2 = "precisionAtRecall";
    paVar1 = &local_b;
    break;
  case precisionAtRecallLabel:
    pcVar2 = "precisionAtRecallLabel";
    paVar1 = &local_c;
    break;
  case recallAtPrecision:
    pcVar2 = "recallAtPrecision";
    paVar1 = &local_d;
    break;
  case recallAtPrecisionLabel:
    pcVar2 = "recallAtPrecisionLabel";
    paVar1 = &local_e;
    break;
  default:
    pcVar2 = "Unknown metric name!";
    paVar1 = &local_f;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::f1scoreLabel:
      return "f1scoreLabel";
    case metric_name::precisionAtRecall:
      return "precisionAtRecall";
    case metric_name::precisionAtRecallLabel:
      return "precisionAtRecallLabel";
    case metric_name::recallAtPrecision:
      return "recallAtPrecision";
    case metric_name::recallAtPrecisionLabel:
      return "recallAtPrecisionLabel";
  }
  return "Unknown metric name!"; // should never happen
}